

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O3

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMP
          (BatchKmersCounter *this,uint8_t K,PairedReadsDatastore *reads,uint64_t gfrom,uint64_t gto
          ,uint64_t batch_size)

{
  byte bVar1;
  char cVar2;
  uint64_t uVar3;
  long lVar4;
  KmerList *other;
  atomic<unsigned_char> *__ptr;
  _func_int *p_Var5;
  long lVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  pointer ppaVar10;
  pointer pvVar11;
  element_type *peVar12;
  ulong uVar13;
  ulong uVar14;
  ostream *poVar15;
  ulong uVar16;
  byte *pbVar17;
  pointer psVar18;
  ulong uVar19;
  int64_t *__args;
  undefined1 *puVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  ushort uVar22;
  atomic<unsigned_char> **bs;
  uint64_t readID;
  ulong uVar23;
  long lVar24;
  pointer ppaVar25;
  undefined7 in_register_00000031;
  ulong uVar26;
  ulong uVar27;
  pointer puVar28;
  ulong uVar29;
  KmerList *pKVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  atomic_uint_fast8_t (*__range1) [3524500];
  ulong uVar35;
  size_t new_size;
  char *s;
  bool bVar36;
  shared_ptr<KmerList> sVar37;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [8];
  ReadSequenceBuffer bprsg;
  StreamKmerFactory128 skf;
  shared_ptr<KmerList> *kmer_list;
  pointer puStack_98;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> read_kmers;
  pointer ppaStack_78;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> batch_status;
  undefined1 auStack_58 [8];
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  batch_lists;
  shared_ptr<KmerList> local_kmer_list;
  
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)CONCAT71(in_register_00000031,K);
  uVar32 = gto - gfrom;
  uVar29 = (uVar32 >> 2) + 1;
  if (batch_size != 0) {
    uVar29 = batch_size;
  }
  uVar13 = (uVar32 + uVar29) - 1;
  uVar22 = 0;
  uVar14 = uVar13 / uVar29;
  uStack_3b0 = 0x1d1f85;
  poVar15 = sdglib::OutputLog(INFO,true);
  uStack_3b0 = 0x1d1f9c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"OMP-merge kmer counting in ",0x1b);
  uStack_3b0 = 0x1d1fa7;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  uStack_3b0 = 0x1d1fbe;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," batches of ",0xc);
  uStack_3b0 = 0x1d1fd0;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  uStack_3b0 = 0x1d1fe7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," reads",6);
  uStack_3b0 = 0x1d1ffb;
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  uStack_3b0 = 0x1d2006;
  std::ostream::put((char)poVar15);
  uStack_3b0 = 0x1d200e;
  std::ostream::flush();
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppaStack_78 = (pointer)0x0;
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (1 < uVar14) {
    uVar22 = 0;
    uVar16 = uVar14;
    do {
      uStack_3b0 = 0x1d2057;
      bprsg._56_8_ = calloc(1,uVar16);
      if (batch_status.
          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          batch_status.
          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uStack_3b0 = 0x1d207d;
        std::vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>>::
        _M_realloc_insert<std::atomic<unsigned_char>*>
                  ((vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>>
                    *)&ppaStack_78,
                   (iterator)
                   batch_status.
                   super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,(atomic<unsigned_char> **)&bprsg.fd);
      }
      else {
        *batch_status.
         super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
         ._M_impl.super__Vector_impl_data._M_start = (atomic<unsigned_char> *)bprsg._56_8_;
        batch_status.
        super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uStack_3b0 = 0x1d20ab;
        std::
        vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                    *)auStack_58,
                   (iterator)
                   batch_lists.
                   super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        batch_lists.
        super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             batch_lists.
             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      uStack_3b0 = 0x1d20bb;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::resize
                (batch_lists.
                 super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1,uVar16);
      uVar22 = uVar22 + 1;
      uVar35 = uVar16 + 1;
      uVar16 = uVar35 >> 1;
    } while (3 < uVar35);
  }
  uStack_3b0 = 0x1d20df;
  poVar15 = sdglib::OutputLog(INFO,true);
  uStack_3b0 = 0x1d20f6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Created ",8);
  uStack_3b0 = 0x1d2105;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  uStack_3b0 = 0x1d211c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," levels",7);
  uStack_3b0 = 0x1d2130;
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  uStack_3b0 = 0x1d213b;
  std::ostream::put((char)poVar15);
  uStack_3b0 = 0x1d2143;
  std::ostream::flush();
  lVar6 = -(ulong)(uVar22 + 0xf & 0xfffffff0);
  if (uVar22 != 0) {
    uVar16 = 0;
    do {
      LOCK();
      local_3a8[uVar16 + lVar6 + -0x3a8 + 0x3a8] = 0;
      UNLOCK();
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2189;
  ReadSequenceBuffer::ReadSequenceBuffer((ReadSequenceBuffer *)local_3a8,reads,100000,1000);
  puStack_98 = (pointer)0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar29 <= uVar13) {
    uVar8 = (batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0xff) * 2;
    uVar35 = -1L << ((byte)uVar8 & 0x3f);
    uVar13 = 0;
    uVar16 = uVar35;
    if ((uVar8 & 0x40) == 0) {
      uVar16 = 0xffffffffffffffff;
      uVar13 = uVar35;
    }
    uVar35 = 0;
    do {
      uVar19 = uVar32 - (uVar14 - 1) * uVar29;
      if (uVar35 < uVar14 - 1) {
        uVar19 = uVar29;
      }
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d227a;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x20);
      readID = uVar35 * uVar29 + gfrom;
      uVar23 = readID + uVar19;
      (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size =
           0x100000001;
      (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kmers =
           (KMerNodeFreq_s *)&PTR___Sp_counted_ptr_inplace_00255c98;
      pKVar30 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].kmers =
           (KMerNodeFreq_s *)0x0;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].size = 0;
      uVar3 = reads->readsize;
      skf.super_KMerFactory128.b2r._M_elems._248_8_ = uVar35;
      batch_lists.
      super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pKVar30;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d22d8;
      KmerList::resize(pKVar30,(uVar19 + 1) * uVar3);
      bprsg.fd._0_1_ =
           (char)batch_status.
                 super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      skf.super_KMerFactory128.fkmer._0_8_ = 0;
      skf.super_KMerFactory128.fkmer._8_8_ = 0;
      skf.super_KMerFactory128.K = '\0';
      skf.super_KMerFactory128._1_7_ = 0;
      skf.super_KMerFactory128.last_unknown = 0;
      skf.super_KMerFactory128.rkmer._0_8_ = 0;
      skf.super_KMerFactory128.b2f._M_elems[0xe8] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xe9] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xea] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xeb] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xec] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xed] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xee] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xef] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf0] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf1] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf2] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf3] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf4] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf5] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf6] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0xf7] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xe8] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xe9] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xea] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xeb] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xec] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xed] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xee] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xef] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf0] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf1] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf2] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf3] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf4] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf5] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf6] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0xf7] = '\0';
      skf.super_KMerFactory128.rkmer._8_8_ = ~uVar13;
      skf.super_KMerFactory128.KMER_MASK._0_8_ = ~uVar16;
      skf.super_KMerFactory128.KMER_MASK._8_8_ = (ulong)uVar8 - 2;
      skf.super_KMerFactory128.KMER_FIRSTOFFSET._0_8_ = (ulong)(1 < (ulong)uVar8) - 1;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2356;
      memset((void *)((long)&skf.super_KMerFactory128.KMER_FIRSTOFFSET + 8),4,0xff);
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d236c;
      memset(skf.super_KMerFactory128.b2f._M_elems + 0xf8,4,0xff);
      skf.super_KMerFactory128.b2f._M_elems[0x39] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0x59] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0x3b] = '\x01';
      skf.super_KMerFactory128.b2f._M_elems[0x5b] = '\x01';
      skf.super_KMerFactory128.b2f._M_elems[0x3f] = '\x02';
      skf.super_KMerFactory128.b2f._M_elems[0x5f] = '\x02';
      skf.super_KMerFactory128.b2f._M_elems[0x4c] = '\x03';
      skf.super_KMerFactory128.b2f._M_elems[0x6c] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x39] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x59] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x3b] = '\x02';
      skf.super_KMerFactory128.b2r._M_elems[0x5b] = '\x02';
      skf.super_KMerFactory128.b2r._M_elems[0x3f] = '\x01';
      skf.super_KMerFactory128.b2r._M_elems[0x5f] = '\x01';
      skf.super_KMerFactory128.b2r._M_elems[0x4c] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0x6c] = '\0';
      new_size = 0;
      while (pvVar11 = batch_lists.
                       super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage, readID = readID + 1,
            readID <= uVar23) {
        *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d23f7;
        pbVar17 = (byte *)ReadSequenceBuffer::get_read_sequence
                                    ((ReadSequenceBuffer *)local_3a8,readID);
        skf.super_KMerFactory128.fkmer._0_8_ = 0;
        skf.super_KMerFactory128.fkmer._8_8_ = 0;
        skf.super_KMerFactory128.K = '\0';
        skf.super_KMerFactory128._1_7_ = 0;
        skf.super_KMerFactory128.last_unknown = 0;
        skf.super_KMerFactory128.rkmer._0_8_ = 0;
        while( true ) {
          puVar28 = read_kmers.
                    super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          bVar1 = *pbVar17;
          if ((bVar1 == 0) || (bVar1 == 10)) break;
          cVar2 = skf.super_KMerFactory128.b2f._M_elems[(ulong)bVar1 - 8];
          uVar35 = (ulong)skf.super_KMerFactory128.rkmer << 2 |
                   skf.super_KMerFactory128.fkmer._8_8_ >> 0x3e;
          uVar19 = skf.super_KMerFactory128.fkmer._8_8_ * 4;
          if (cVar2 == '\x04') {
            uVar34 = (ulong)skf.super_KMerFactory128.last_unknown >> 2 |
                     (ulong)skf.super_KMerFactory128.fkmer << 0x3e;
            uVar33 = 3L << (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f);
            uVar27 = uVar33;
            uVar26 = 0L << (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f) |
                     3UL >> 0x40 - (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f);
            if ((skf.super_KMerFactory128.KMER_MASK._8_8_ & 0x40) != 0) {
              uVar27 = 0;
              uVar26 = uVar33;
            }
            skf.super_KMerFactory128.last_unknown = uVar27 + uVar34;
            skf.super_KMerFactory128.fkmer._0_8_ =
                 uVar26 + ((ulong)skf.super_KMerFactory128.fkmer >> 2) +
                 (ulong)CARRY8(uVar27,uVar34);
            skf.super_KMerFactory128._0_8_ = 0;
          }
          else {
            uVar26 = (ulong)cVar2;
            bVar36 = CARRY8(uVar19,uVar26);
            uVar19 = uVar19 + uVar26;
            uVar35 = uVar35 + ((long)uVar26 >> 0x3f) + (ulong)bVar36;
            uVar27 = (ulong)skf.super_KMerFactory128.last_unknown >> 2 |
                     (ulong)skf.super_KMerFactory128.fkmer << 0x3e;
            uVar26 = (ulong)skf.super_KMerFactory128.b2r._M_elems[(ulong)bVar1 - 8];
            uVar34 = uVar26 << (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f);
            bVar36 = (skf.super_KMerFactory128.KMER_MASK._8_8_ & 0x40) != 0;
            uVar26 = ((long)uVar26 >> 0x3f) << (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f) |
                     uVar26 >> 0x40 - (skf.super_KMerFactory128.KMER_MASK._8_1_ & 0x3f);
            if (bVar36) {
              uVar26 = uVar34;
            }
            uVar33 = 0;
            if (!bVar36) {
              uVar33 = uVar34;
            }
            skf.super_KMerFactory128.last_unknown = uVar33 + uVar27;
            skf.super_KMerFactory128.fkmer._0_8_ =
                 uVar26 + ((ulong)skf.super_KMerFactory128.fkmer >> 2) +
                 (ulong)CARRY8(uVar33,uVar27);
            skf.super_KMerFactory128._0_8_ = skf.super_KMerFactory128._0_8_ + 1;
          }
          skf.super_KMerFactory128.fkmer._8_8_ = uVar19 & skf.super_KMerFactory128.rkmer._8_8_;
          skf.super_KMerFactory128.rkmer._0_8_ = uVar35 & (ulong)skf.super_KMerFactory128.KMER_MASK;
          if ((long)(bprsg._56_8_ & 0xff) <= (long)skf.super_KMerFactory128._0_8_) {
            if (read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              __args = (int64_t *)((long)&skf.super_KMerFactory128.fkmer + 8);
              if ((ulong)skf.super_KMerFactory128.fkmer <= (ulong)skf.super_KMerFactory128.rkmer &&
                  (ulong)(skf.super_KMerFactory128.fkmer._8_8_ <
                         (ulong)skf.super_KMerFactory128.last_unknown) <=
                  (ulong)skf.super_KMerFactory128.rkmer - (ulong)skf.super_KMerFactory128.fkmer) {
                __args = &skf.super_KMerFactory128.last_unknown;
              }
              *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2548;
              std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
              _M_realloc_insert<unsigned__int128&>
                        ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)&puStack_98,
                         (iterator)puVar28,(unsigned___int128 *)__args);
            }
            else {
              uVar19 = (ulong)skf.super_KMerFactory128.rkmer;
              uVar35 = skf.super_KMerFactory128.fkmer._8_8_;
              if ((ulong)skf.super_KMerFactory128.fkmer < (ulong)skf.super_KMerFactory128.rkmer ||
                  (ulong)skf.super_KMerFactory128.fkmer - (ulong)skf.super_KMerFactory128.rkmer <
                  (ulong)((ulong)skf.super_KMerFactory128.last_unknown <
                         skf.super_KMerFactory128.fkmer._8_8_)) {
                uVar19 = (ulong)skf.super_KMerFactory128.fkmer;
                uVar35 = skf.super_KMerFactory128.last_unknown;
              }
              *(ulong *)((long)read_kmers.
                               super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8) = uVar19;
              *(ulong *)read_kmers.
                        super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                        _M_impl.super__Vector_impl_data._M_start = uVar35;
              read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   read_kmers.
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl
                   .super__Vector_impl_data._M_start + 1;
            }
          }
          pbVar17 = pbVar17 + 1;
        }
        if (puStack_98 !=
            read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          puVar20 = (undefined1 *)
                    ((long)((batch_lists.
                             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + new_size * 0x11 + 0x10);
          puVar28 = puStack_98;
          do {
            uVar9 = *(undefined8 *)((long)puVar28 + 8);
            *(long *)(puVar20 + -0x10) = (long)*puVar28;
            *(undefined8 *)(puVar20 + -8) = uVar9;
            *puVar20 = 1;
            new_size = new_size + 1;
            puVar28 = puVar28 + 1;
            puVar20 = puVar20 + 0x11;
          } while (puVar28 !=
                   read_kmers.
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl
                   .super__Vector_impl_data._M_start);
          if (puStack_98 !=
              read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
            _M_impl.super__Vector_impl_data._M_start = puStack_98;
          }
        }
      }
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2618;
      KmerList::resize((KmerList *)pvVar11,new_size);
      pvVar11 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2621;
      KmerList::sort((KmerList *)pvVar11);
      pvVar11 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2631;
      KmerList::uniq((KmerList *)pvVar11);
      uVar35 = 0;
      while( true ) {
        uVar35 = uVar35 & 0xffff;
        LOCK();
        pbVar17 = local_3a8 + uVar35 + lVar6 + -0x3a8 + 0x3a8;
        bVar1 = *pbVar17;
        *pbVar17 = *pbVar17 + 1;
        UNLOCK();
        uVar19 = (ulong)bVar1;
        iVar7 = (int)uVar35;
        if (((long)(((pointer)((long)auStack_58 + uVar35 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(((pointer)((long)auStack_58 + uVar35 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U == uVar19) {
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2671;
          poVar15 = sdglib::OutputLog(INFO,true);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2688;
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"level ",6);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2694;
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar7 + 1);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d26ab;
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," done.",6);
          p_Var5 = poVar15->_vptr_basic_ostream[-3];
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d26bf;
          std::ios::widen((char)p_Var5 + (char)poVar15);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d26ca;
          std::ostream::put((char)poVar15);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d26d2;
          std::ostream::flush();
        }
        if ((int)(uVar22 - 1) <= iVar7) break;
        if ((bVar1 & 1) == 0) {
          psVar18 = (((pointer)((long)auStack_58 + uVar35 * 0x18))->
                    super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (((long)(((pointer)((long)auStack_58 + uVar35 * 0x18))->
                     super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar18 >> 4) - 1U !=
              uVar19) goto LAB_001d27a5;
        }
        else {
          uVar23 = (ulong)(bVar1 - 1);
          while (pvVar11 = batch_lists.
                           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                ppaStack_78[uVar35][uVar23].super___atomic_base<unsigned_char>._M_i != '\x01') {
            *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d272e;
            usleep(10);
          }
          uVar35 = (ulong)(uint)(iVar7 * 8);
          LOCK();
          *(undefined1 *)(*(long *)((long)ppaStack_78 + uVar35) + uVar23) = 2;
          UNLOCK();
          LOCK();
          *(undefined1 *)(*(long *)((long)ppaStack_78 + uVar35) + uVar19) = 2;
          UNLOCK();
          lVar24 = uVar23 * 0x10;
          pKVar30 = *(KmerList **)
                     (*(long *)((long)&(((_Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                                          *)auStack_58)->_M_impl).super__Vector_impl_data._M_start +
                               uVar35 * 3) + lVar24);
          *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2770;
          KmerList::merge((KmerList *)pvVar11,pKVar30);
          lVar4 = *(long *)((long)&(((_Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                                      *)auStack_58)->_M_impl).super__Vector_impl_data._M_start +
                           uVar35 * 3);
          *(undefined8 *)(lVar4 + lVar24) = 0;
          p_Var31 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 8 + lVar24);
          *(undefined8 *)(lVar4 + 8 + lVar24) = 0;
          if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2792;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
          }
        }
        uVar35 = (ulong)(iVar7 + 1);
      }
      psVar18 = (((pointer)((long)auStack_58 + uVar35 * 0x18))->
                super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
LAB_001d27a5:
      psVar18[bVar1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           batch_lists.
           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d27c4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&psVar18[bVar1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_kmer_list);
      peVar12 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      batch_lists.
      super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (peVar12 != (element_type *)0x0) {
        *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d27d9;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12);
      }
      peVar12 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      LOCK();
      ppaStack_78[uVar35][uVar19].super___atomic_base<unsigned_char>._M_i = '\x01';
      UNLOCK();
      if (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d27f5;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12);
      }
      puVar28 = puStack_98;
      uVar35 = skf.super_KMerFactory128.b2r._M_elems._248_8_ + 1;
    } while (uVar35 < uVar14);
    if (puStack_98 != (pointer)0x0) {
      uVar29 = (long)read_kmers.
                     super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puStack_98;
      *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2832;
      operator_delete(puVar28,uVar29);
    }
  }
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d283e;
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)local_3a8);
  psVar18 = batch_lists.
            super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].
            super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pKVar30 = (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  other = psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2852;
  KmerList::merge(pKVar30,other);
  psVar18 = batch_lists.
            super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].
            super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(element_type **)this =
       (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var31 = (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var31;
  if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
    ;
    (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      UNLOCK();
      psVar18 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].
                super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var31 = (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var31 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001d28ac;
    }
    else {
      p_Var31->_M_use_count = p_Var31->_M_use_count + 1;
      (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d28ac;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
  }
LAB_001d28ac:
  psVar18 = batch_lists.
            super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].
            super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var31 = psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ppaVar25 = ppaStack_78;
  ppaVar10 = batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d28cc;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    ppaVar25 = ppaStack_78;
    ppaVar10 = batch_status.
               super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppaVar25 != ppaVar10; ppaVar25 = ppaVar25 + 1) {
    __ptr = *ppaVar25;
    *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d28e1;
    free(__ptr);
  }
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d28f3;
  poVar15 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d290a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Total kmers processed ",0x16);
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2919;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  p_Var5 = poVar15->_vptr_basic_ostream[-3];
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2930;
  std::ios::widen((char)p_Var5 + (char)poVar15);
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d293b;
  std::ostream::put((char)poVar15);
  *(undefined8 *)(local_3a8 + lVar6 + -8) = 0x1d2943;
  std::ostream::flush();
  uStack_3b0 = 0x1d2953;
  std::
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
             *)auStack_58);
  _Var21._M_pi = extraout_RDX;
  if (ppaStack_78 != (pointer)0x0) {
    uStack_3b0 = 0x1d2968;
    operator_delete(ppaStack_78,
                    (long)batch_status.
                          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppaStack_78);
    _Var21._M_pi = extraout_RDX_00;
  }
  sVar37.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var21._M_pi;
  sVar37.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar37.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMP(uint8_t K, PairedReadsDatastore const &reads, uint64_t gfrom, uint64_t gto, uint64_t batch_size) {
    uint64_t totalKmers(0);
    //Compute how many "batches" will be used. and malloc a structure for them and a bool array to mark them "ready to process".
    //optionally, there could be a total count of "ready kmers" to set a limit for memory usage, if total count is too high, slaves would wait
    if (batch_size == 0) batch_size = (gto - gfrom) / (4 * omp_get_max_threads()) + 1;
    const uint64_t batches = ((gto - gfrom) + batch_size - 1) / batch_size;
    sdglib::OutputLog() << "OMP-merge kmer counting in " << batches << " batches of " << batch_size << " reads" << std::endl;

    std::vector<std::atomic_uint_fast8_t *> batch_status; //level->batch->status

    std::vector<std::vector<std::shared_ptr<KmerList>>> batch_lists; //level->batch-> pointer to batch
    uint16_t levels = 0;
    for (auto elements = batches; elements > 1; elements = (elements + 1) / 2) {
        batch_status.push_back((std::atomic_uint_fast8_t *) calloc(sizeof(std::atomic_uint_fast8_t), elements));
        batch_lists.emplace_back();
        batch_lists.back().resize(elements);
//        sdglib::OutputLog() << "level " << levels << " created with " << elements << " elements " << std::endl;
        ++levels;
    }
    sdglib::OutputLog() << "Created " << levels << " levels" << std::endl;
    std::atomic_uint_fast8_t level_count[levels]; //level->count
    for (auto &l:level_count)l = 0;

#pragma omp parallel shared(reads) reduction(+:totalKmers)
    {
        ReadSequenceBuffer bprsg(reads,100000,1000);
        std::vector<__uint128_t> read_kmers;
#pragma omp for schedule(dynamic)
        for (auto batch = 0; batch < batches; ++batch) {
            //==== Part 1: actually counting ====
            uint64_t from = gfrom + batch * batch_size;
            uint64_t read_count = (batch < batches - 1) ? batch_size : (gto - gfrom) - batch_size * (batches - 1);
            uint64_t to = from + read_count;

            std::shared_ptr<KmerList> local_kmer_list = std::make_shared<KmerList>();
            uint64_t total_good_length = reads.readsize*(to-from+1);
            local_kmer_list->resize(total_good_length);
            //Populate the kmer list
            uint64_t last_kmer=0;

            // Replace with generating all the kmers from the reads!
            StreamKmerFactory128 skf(K);

            for (uint64_t rid=from+1; rid<= to; ++rid) {
                skf.produce_all_kmers(bprsg.get_read_sequence(rid), read_kmers);
                for (const auto &rk: read_kmers){
                    local_kmer_list->kmers[last_kmer].kdata=rk;
                    local_kmer_list->kmers[last_kmer].count=1;
                    ++last_kmer;
                }
                read_kmers.clear();
            }

            totalKmers += last_kmer;
            //std::cout<<last_kmer<<" kmers inserted in a batch"<<std::endl;
            local_kmer_list->resize(last_kmer);
            local_kmer_list->sort();
            local_kmer_list->uniq();
            //std::cout<<local_kmer_list->size<<" unique kmers in a batch"<<std::endl;
            //std::sort(local_kmer_list->begin(), local_kmer_list->end());
            //collapse_entries(*local_kmer_list);

            //==== Part 2: merging till no results of same level available ====
            //merge_level=0
            uint16_t merge_level = 0;
            bool just_merged = true;
            //while (just merged)
            while (just_merged) {
                //   insert the list into this merge level's queue
                uint16_t slot = level_count[merge_level]++;
                if (slot == batch_lists[merge_level].size() - 1) {
#pragma omp critical
                    sdglib::OutputLog() << "level " << (merge_level+1) << " done." << std::endl;
                }
                //   if insertion number is odd or last batch:
                if (merge_level < levels - 1 and (slot % 2 == 1 or slot == batch_lists[merge_level].size() - 1)) {
                    // mix with the previous even number (using own list as base, this way we preserve locality)
                    if (slot % 2 == 1) {
                        while (batch_status[merge_level][slot - 1] != 1)
                            usleep(10); //wait for the previous batch to be finished.
                        batch_status[merge_level][slot - 1] = 2;
                        batch_status[merge_level][slot] = 2;
                        //inplace_count_merge(local_kmer_list, batch_lists[merge_level][slot - 1]);
                        local_kmer_list->merge(*batch_lists[merge_level][slot - 1]);
                        batch_lists[merge_level][slot - 1].reset();
                    }
                    //      increase level
                    ++merge_level;
                    just_merged = true;
                } else {
                    // no batch available for merging, next thread at this level will pick up
                    batch_lists[merge_level][slot] = local_kmer_list;
                    local_kmer_list.reset();
                    batch_status[merge_level][slot] = 1;
                    just_merged = false;
                }
                //IDEA: fixed partitioning can be used to keep 2*thread-number lists for longer.
            }
        }

    }


//    sdglib::OutputLog() << "Top level merge starting" << std::endl;
    //inplace_count_merge(batch_lists.back()[0], batch_lists.back()[1]);
    batch_lists.back()[0]->merge(*batch_lists.back()[1]);
//    sdglib::OutputLog() << "Top level merge done" << std::endl;
    std::shared_ptr<KmerList> kmer_list = batch_lists.back()[0];
    batch_lists.back()[0].reset();
    batch_lists.back()[1].reset();
    for (auto &bs:batch_status) free(bs);
//    sdglib::OutputLog() << "cleanup done" << std::endl;
    sdglib::OutputLog() << "Total kmers processed " << totalKmers << std::endl;
    return kmer_list;
}